

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircularBufferTest.cpp
# Opt level: O2

void __thiscall CircBufTest::thread2main(CircBufTest *this)

{
  CircularBuffer *pCVar1;
  int iVar2;
  long lVar3;
  uint8_t *puVar4;
  uint8_t dumpBuf [128];
  uint8_t buf [128];
  
  for (lVar3 = 0; lVar3 != 0x80; lVar3 = lVar3 + 1) {
    buf[lVar3] = 0xff;
  }
  for (lVar3 = 0; lVar3 != 0x80; lVar3 = lVar3 + 1) {
    dumpBuf[lVar3] = '\n';
  }
  pCVar1 = &this->gbuff;
  Mutex::Lock();
  iVar2 = JetHead::CircularBuffer::getLength();
  puVar4 = buf;
  JetHead::CircularBuffer::write((uchar *)pCVar1,(int)puVar4);
  JetHead::CircularBuffer::getLength();
  JetHead::CircularBuffer::copy((uchar *)pCVar1,(int)dumpBuf);
  for (lVar3 = (long)iVar2; lVar3 < iVar2 + 0x40; lVar3 = lVar3 + 1) {
    if (*puVar4 != dumpBuf[lVar3]) {
      TestCase::TestFailedInternal
                (&this->super_TestCase,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
                 ,0x350,"Lock doesn\'t work.");
    }
    puVar4 = puVar4 + 1;
  }
  Mutex::Unlock();
  iVar2 = JetHead::CircularBuffer::waitForFreeSpace((int)pCVar1,0x80);
  if (iVar2 == 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
               ,0x357,"waitForFreeSpace might be broken.");
  }
  return;
}

Assistant:

void CircBufTest::thread2main()
{

	uint8_t buf[BUFFER_SIZE];
	uint8_t dumpBuf[BUFFER_SIZE];

	fill(buf, buf + BUFFER_SIZE, -1);
	fill(dumpBuf, dumpBuf + BUFFER_SIZE, 10);

	gbuff.Lock();
	int offset = gbuff.getLength();

	gbuff.write(buf, BUFFER_SIZE / 2);

	gbuff.copy(dumpBuf, gbuff.getLength());

	for( int i = 0 + offset; i < offset + (BUFFER_SIZE / 2); ++i)
		if( buf[i - offset] != dumpBuf[i] )
			TestFailed("Lock doesn't work.");


	gbuff.Unlock();

	// Wait till the other guy clears the buffer.
	if(!gbuff.waitForFreeSpace(BUFFER_SIZE, 1000))
		TestFailed("waitForFreeSpace might be broken.");


}